

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O3

LY_ERR lysp_stmt_leaf(lysp_ctx *ctx,lysp_stmt *stmt,lysp_node *parent,lysp_node **siblings)

{
  lysp_ext_instance **exts;
  uint16_t *flags;
  ly_stmt stmt_00;
  lysp_node *plVar1;
  int iVar2;
  LY_ERR LVar3;
  lysp_node *plVar4;
  lysp_node *plVar5;
  char *format;
  uint32_t substmt_index;
  ly_ctx *plVar6;
  yang_arg arg;
  lysp_ext_instance **in_R8;
  char *pcVar7;
  lysp_ext_instance **in_R9;
  lysp_stmt *stmt_01;
  
  LVar3 = lysp_stmt_validate_value(ctx,Y_IDENTIF_ARG,stmt->arg);
  if (LVar3 == LY_SUCCESS) {
    plVar4 = (lysp_node *)calloc(1,0xd8);
    if (plVar4 == (lysp_node *)0x0) {
      if (ctx == (lysp_ctx *)0x0) {
        plVar6 = (ly_ctx *)0x0;
      }
      else {
        plVar6 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      LVar3 = LY_EMEM;
      ly_log(plVar6,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_stmt_leaf");
    }
    else {
      plVar1 = *siblings;
      if (*siblings != (lysp_node *)0x0) {
        do {
          plVar5 = plVar1;
          plVar1 = plVar5->next;
        } while (plVar1 != (lysp_node *)0x0);
        siblings = &plVar5->next;
      }
      *siblings = plVar4;
      plVar4->nodetype = 4;
      plVar4->parent = parent;
      if (ctx == (lysp_ctx *)0x0) {
        plVar6 = (ly_ctx *)0x0;
      }
      else {
        plVar6 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      LVar3 = lydict_insert(plVar6,stmt->arg,0,&plVar4->name);
      if (LVar3 == LY_SUCCESS) {
        stmt_01 = stmt->child;
        if (stmt_01 != (lysp_stmt *)0x0) {
          exts = &plVar4->exts;
          iVar2 = (int)plVar4;
          flags = &plVar4->flags;
          do {
            stmt_00 = stmt_01->kw;
            arg = (yang_arg)exts;
            if ((int)stmt_00 < 0x1d0000) {
              if (0xeffff < (int)stmt_00) {
                if (stmt_00 == LY_STMT_EXTENSION_INSTANCE) {
                  in_R8 = exts;
                  LVar3 = lysp_stmt_ext(ctx,stmt_01,LY_STMT_LEAF,0,exts);
                }
                else if (stmt_00 == LY_STMT_IF_FEATURE) {
                  LVar3 = lysp_stmt_qnames(ctx,stmt_01,&plVar4->iffeatures,arg,in_R8);
                }
                else {
                  if (stmt_00 != LY_STMT_MANDATORY) goto LAB_00169fcc;
                  LVar3 = lysp_stmt_mandatory(ctx,stmt_01,flags,exts);
                }
                goto LAB_00169f32;
              }
              if (stmt_00 == LY_STMT_CONFIG) {
                LVar3 = lysp_stmt_config(ctx,stmt_01,flags,exts);
                goto LAB_00169f32;
              }
              if (stmt_00 != LY_STMT_DEFAULT) {
                substmt_index = iVar2 + 0x20;
                if (stmt_00 == LY_STMT_DESCRIPTION) goto LAB_00169ed7;
LAB_00169fcc:
                if (ctx == (lysp_ctx *)0x0) {
                  plVar6 = (ly_ctx *)0x0;
                }
                else {
                  plVar6 = (ly_ctx *)
                           **(undefined8 **)
                             (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                }
                pcVar7 = lyplg_ext_stmt2str(stmt_00);
                format = "Invalid keyword \"%s\" as a child of \"%s\".";
                goto LAB_00169fba;
              }
              in_R8 = exts;
              LVar3 = lysp_stmt_text_field(ctx,stmt_01,iVar2 + 0xc0,(char **)0x2,arg,in_R9);
              if (LVar3 != LY_SUCCESS) {
                return LVar3;
              }
              *(lyd_node **)&plVar4[3].nodetype =
                   (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
            }
            else {
              if ((int)stmt_00 < 0x2e0000) {
                if (stmt_00 == LY_STMT_MUST) {
                  LVar3 = lysp_stmt_restrs(ctx,stmt_01,(lysp_restr **)(plVar4 + 1));
                }
                else {
                  substmt_index = iVar2 + 0x28;
                  if (stmt_00 == LY_STMT_REFERENCE) {
LAB_00169ed7:
                    in_R8 = exts;
                    LVar3 = lysp_stmt_text_field(ctx,stmt_01,substmt_index,(char **)0x2,arg,in_R9);
                  }
                  else {
                    if (stmt_00 != LY_STMT_STATUS) goto LAB_00169fcc;
                    LVar3 = lysp_stmt_status(ctx,stmt_01,flags,exts);
                  }
                }
              }
              else if (stmt_00 == LY_STMT_TYPE) {
                LVar3 = lysp_stmt_type(ctx,stmt_01,(lysp_type *)&plVar4[1].next);
              }
              else {
                substmt_index = iVar2 + 0xb8;
                if (stmt_00 == LY_STMT_UNITS) goto LAB_00169ed7;
                if (stmt_00 != LY_STMT_WHEN) goto LAB_00169fcc;
                LVar3 = lysp_stmt_when(ctx,stmt_01,(lysp_when **)&plVar4[1].nodetype);
              }
LAB_00169f32:
              if (LVar3 != LY_SUCCESS) {
                return LVar3;
              }
            }
            stmt_01 = stmt_01->next;
          } while (stmt_01 != (lysp_stmt *)0x0);
        }
        LVar3 = LY_SUCCESS;
        if (plVar4[1].next == (lysp_node *)0x0) {
          if (ctx == (lysp_ctx *)0x0) {
            plVar6 = (ly_ctx *)0x0;
          }
          else {
            plVar6 = (ly_ctx *)
                     **(undefined8 **)
                       (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          format = "Missing mandatory keyword \"%s\" as a child of \"%s\".";
          pcVar7 = "type";
LAB_00169fba:
          ly_vlog(plVar6,(char *)0x0,LYVE_SYNTAX_YANG,format,pcVar7,"leaf");
          LVar3 = LY_EVALID;
        }
      }
    }
  }
  return LVar3;
}

Assistant:

static LY_ERR
lysp_stmt_leaf(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, struct lysp_node *parent, struct lysp_node **siblings)
{
    struct lysp_node_leaf *leaf;

    LY_CHECK_RET(lysp_stmt_validate_value(ctx, Y_IDENTIF_ARG, stmt->arg));

    /* create new leaf structure */
    LY_LIST_NEW_RET(PARSER_CTX(ctx), siblings, leaf, next, LY_EMEM);
    leaf->nodetype = LYS_LEAF;
    leaf->parent = parent;

    /* get name */
    LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), stmt->arg, 0, &leaf->name));

    /* parse substatements */
    for (const struct lysp_stmt *child = stmt->child; child; child = child->next) {
        switch (child->kw) {
        case LY_STMT_CONFIG:
            LY_CHECK_RET(lysp_stmt_config(ctx, child, &leaf->flags, &leaf->exts));
            break;
        case LY_STMT_DEFAULT:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &leaf->dflt.str, Y_STR_ARG, &leaf->exts));
            leaf->dflt.mod = PARSER_CUR_PMOD(ctx);
            break;
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &leaf->dsc, Y_STR_ARG, &leaf->exts));
            break;
        case LY_STMT_IF_FEATURE:
            LY_CHECK_RET(lysp_stmt_qnames(ctx, child, &leaf->iffeatures, Y_STR_ARG, &leaf->exts));
            break;
        case LY_STMT_MANDATORY:
            LY_CHECK_RET(lysp_stmt_mandatory(ctx, child, &leaf->flags, &leaf->exts));
            break;
        case LY_STMT_MUST:
            LY_CHECK_RET(lysp_stmt_restrs(ctx, child, &leaf->musts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &leaf->ref, Y_STR_ARG, &leaf->exts));
            break;
        case LY_STMT_STATUS:
            LY_CHECK_RET(lysp_stmt_status(ctx, child, &leaf->flags, &leaf->exts));
            break;
        case LY_STMT_TYPE:
            LY_CHECK_RET(lysp_stmt_type(ctx, child, &leaf->type));
            break;
        case LY_STMT_UNITS:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &leaf->units, Y_STR_ARG, &leaf->exts));
            break;
        case LY_STMT_WHEN:
            LY_CHECK_RET(lysp_stmt_when(ctx, child, &leaf->when));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(lysp_stmt_ext(ctx, child, LY_STMT_LEAF, 0, &leaf->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw), "leaf");
            return LY_EVALID;
        }
    }

    /* mandatory substatements */
    if (!leaf->type.name) {
        LOGVAL_PARSER(ctx, LY_VCODE_MISSTMT, "type", "leaf");
        return LY_EVALID;
    }

    return LY_SUCCESS;
}